

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O3

void __thiscall
validation_block_tests::MinerTestingSetup::BuildChain
          (MinerTestingSetup *this,uint256 *root,int height,uint invalid_rate,uint branch_rate,
          uint max_size,
          vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
          *blocks)

{
  FastRandomContext *this_00;
  uint64_t uVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  shared_ptr<const_CBlock> pblock;
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  __uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_> local_38;
  
  local_38._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       *(tuple<AddrMan_*,_std::default_delete<AddrMan>_> *)(in_FS_OFFSET + 0x28);
  if ((0 < height) &&
     ((ulong)((long)(blocks->
                    super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(blocks->
                    super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) < (ulong)max_size)) {
    this_00 = &(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.
               super_BasicTestingSetup.m_rng;
    do {
      uVar1 = RandomMixin<FastRandomContext>::randbits
                        (&this_00->super_RandomMixin<FastRandomContext>,7);
    } while (99 < uVar1);
    do {
      uVar2 = RandomMixin<FastRandomContext>::randbits
                        (&this_00->super_RandomMixin<FastRandomContext>,7);
    } while (99 < uVar2);
    if ((uint)uVar1 < invalid_rate) {
      BadBlock((MinerTestingSetup *)local_68,(uint256 *)this);
    }
    else {
      GoodBlock((MinerTestingSetup *)local_68,(uint256 *)this);
    }
    std::vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>::
    push_back(blocks,(value_type *)local_68);
    if (invalid_rate <= (uint)uVar1) {
      CBlockHeader::GetHash((uint256 *)local_58,(CBlockHeader *)local_68._0_8_);
      BuildChain(this,(uint256 *)local_58,height + -1,invalid_rate,branch_rate,max_size,blocks);
    }
    if ((uint)uVar2 < branch_rate) {
      GoodBlock((MinerTestingSetup *)local_58,(uint256 *)this);
      std::vector<std::shared_ptr<CBlock_const>,std::allocator<std::shared_ptr<CBlock_const>>>::
      emplace_back<std::shared_ptr<CBlock_const>>
                ((vector<std::shared_ptr<CBlock_const>,std::allocator<std::shared_ptr<CBlock_const>>>
                  *)blocks,(shared_ptr<const_CBlock> *)local_58);
      if ((ECC_Context *)local_58._8_8_ != (ECC_Context *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
      CBlockHeader::GetHash
                ((uint256 *)local_58,
                 &((blocks->
                   super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish[-1].
                   super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_CBlockHeader);
      BuildChain(this,(uint256 *)local_58,height + -1,invalid_rate,branch_rate,max_size,blocks);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
  }
  if ((tuple<AddrMan_*,_std::default_delete<AddrMan>_>)*(AddrMan **)(in_FS_OFFSET + 0x28) !=
      (_Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>)
      local_38._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
      super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MinerTestingSetup::BuildChain(const uint256& root, int height, const unsigned int invalid_rate, const unsigned int branch_rate, const unsigned int max_size, std::vector<std::shared_ptr<const CBlock>>& blocks)
{
    if (height <= 0 || blocks.size() >= max_size) return;

    bool gen_invalid = m_rng.randrange(100U) < invalid_rate;
    bool gen_fork = m_rng.randrange(100U) < branch_rate;

    const std::shared_ptr<const CBlock> pblock = gen_invalid ? BadBlock(root) : GoodBlock(root);
    blocks.push_back(pblock);
    if (!gen_invalid) {
        BuildChain(pblock->GetHash(), height - 1, invalid_rate, branch_rate, max_size, blocks);
    }

    if (gen_fork) {
        blocks.push_back(GoodBlock(root));
        BuildChain(blocks.back()->GetHash(), height - 1, invalid_rate, branch_rate, max_size, blocks);
    }
}